

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlcxx2_html.hpp
# Opt level: O3

size_t __thiscall htmlcxx2::HTML::Node::parseAttributes(Node *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte bVar7;
  byte *pbVar8;
  uint __c;
  byte *pbVar9;
  string val;
  string key;
  string local_a8;
  string local_88;
  size_t local_68;
  byte *local_60;
  byte *local_58;
  string local_50;
  
  if (this->kind_ == NODE_TAG) {
    if (this->attributesParsed_ == true) {
LAB_0015855b:
      return (long)(this->attributeKeys_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->attributeKeys_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    }
    this->attributesParsed_ = true;
    pcVar3 = strchr((this->text_)._M_dataplus._M_p,0x3c);
    if (pcVar3 != (char *)0x0) {
      pbVar9 = (byte *)(pcVar3 + -2);
      do {
        bVar7 = pbVar9[3];
        iVar2 = isspace((uint)bVar7);
        pbVar9 = pbVar9 + 1;
      } while (iVar2 != 0);
      iVar2 = isalpha((uint)bVar7);
      if (iVar2 != 0) {
        do {
          bVar7 = pbVar9[2];
          iVar2 = isspace((uint)bVar7);
          pbVar9 = pbVar9 + 1;
          if (bVar7 == 0x3e) break;
        } while (iVar2 == 0);
        do {
          bVar7 = pbVar9[1];
          pbVar9 = pbVar9 + 1;
          iVar2 = isspace((uint)bVar7);
        } while (iVar2 != 0);
        while( true ) {
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          if ((bVar7 == 0) || (bVar7 == 0x3e)) break;
          local_88._M_string_length = 0;
          local_88.field_2._M_local_buf[0] = '\0';
          local_a8._M_string_length = 0;
          local_a8.field_2._M_local_buf[0] = '\0';
          bVar7 = *pbVar9;
          while (bVar7 != 0) {
            iVar2 = isalnum((uint)bVar7);
            if ((iVar2 != 0) || (iVar2 = isspace((uint)bVar7), iVar2 != 0)) break;
            pbVar8 = pbVar9 + 1;
            pbVar9 = pbVar9 + 1;
            bVar7 = *pbVar8;
          }
          pbVar8 = pbVar9 + -1;
          do {
            pbVar4 = pbVar8;
            pbVar8 = pbVar4 + 1;
            iVar2 = isspace((uint)pbVar4[1]);
            pbVar5 = pbVar9;
            pbVar9 = pbVar9 + 1;
          } while (iVar2 != 0);
          do {
            do {
              pbVar6 = pbVar5;
              pbVar9 = pbVar4 + 1;
              bVar7 = pbVar4[1];
              local_58 = pbVar4;
              iVar2 = isalnum((uint)bVar7);
              pbVar4 = pbVar9;
              pbVar5 = pbVar6 + 1;
              local_60 = pbVar6;
            } while (bVar7 == 0x2d);
          } while (iVar2 != 0);
          std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)pbVar8);
          pbVar8 = local_60;
          pbVar9 = local_58;
          do {
            bVar7 = pbVar9[1];
            pbVar9 = pbVar9 + 1;
            iVar2 = isspace((uint)bVar7);
            pbVar8 = pbVar8 + 1;
          } while (iVar2 != 0);
          if (bVar7 == 0x3d) {
            do {
              pbVar8 = pbVar9;
              bVar7 = pbVar8[1];
              pbVar9 = pbVar8 + 1;
              __c = (uint)bVar7;
              iVar2 = isspace(__c);
            } while (iVar2 != 0);
            pbVar4 = pbVar9;
            if (bVar7 == 0) {
LAB_00158818:
              std::__cxx11::string::replace
                        ((ulong)&local_a8,0,(char *)local_a8._M_string_length,(ulong)pbVar9);
            }
            else {
              if ((__c != 0x22) && (__c != 0x27)) {
                do {
                  iVar2 = isspace((uint)bVar7);
                  if ((bVar7 == 0x3e) || (iVar2 != 0)) break;
                  bVar7 = pbVar4[1];
                  pbVar4 = pbVar4 + 1;
                } while (bVar7 != 0);
                goto LAB_00158818;
              }
              pbVar8 = pbVar8 + 2;
              pbVar4 = (byte *)strchr((char *)pbVar8,__c);
              if (pbVar4 == (byte *)0x0) {
                pbVar5 = (byte *)strchr((char *)pbVar8,0x20);
                pbVar6 = (byte *)strchr((char *)pbVar8,0x3e);
                pbVar4 = pbVar6;
                if (pbVar5 < pbVar6) {
                  pbVar4 = pbVar5;
                }
                if (pbVar5 == (byte *)0x0) {
                  pbVar4 = pbVar6;
                }
                if (pbVar4 == (byte *)0x0) {
                  local_68 = (long)(this->attributeKeys_).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->attributeKeys_).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5;
                  bVar1 = false;
                  goto LAB_001588a4;
                }
              }
              do {
                pbVar5 = pbVar8;
                iVar2 = isspace((uint)*pbVar5);
                pbVar9 = pbVar4;
                if (pbVar4 <= pbVar5) break;
                pbVar8 = pbVar5 + 1;
              } while (iVar2 != 0);
              do {
                pbVar9 = pbVar9 + -1;
                iVar2 = isspace((uint)*pbVar9);
                if (pbVar9 < pbVar5) break;
              } while (iVar2 != 0);
              std::__cxx11::string::replace
                        ((ulong)&local_a8,0,(char *)local_a8._M_string_length,(ulong)pbVar5);
              pbVar4 = pbVar4 + 1;
            }
            addAttribute(this,&local_88,&local_a8);
            bVar1 = true;
            pbVar9 = pbVar4;
          }
          else {
            bVar1 = true;
            if (local_88._M_string_length != 0) {
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"","",pbVar8);
              addAttribute(this,&local_88,&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
LAB_001588a4:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,
                            CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                     local_a8.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,
                            CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                     local_88.field_2._M_local_buf[0]) + 1);
          }
          if (!bVar1) {
            return local_68;
          }
          bVar7 = *pbVar9;
        }
        goto LAB_0015855b;
      }
    }
  }
  return 0;
}

Assistant:

bool isTag() const                     { return kind_ == NODE_TAG; }